

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

uint8_t netaddr_get_af_maxprefix(uint32_t af_type)

{
  undefined1 local_9;
  uint32_t af_type_local;
  
  if (af_type == 2) {
    local_9 = ' ';
  }
  else if (af_type == 10) {
    local_9 = 0x80;
  }
  else if (af_type == 0x2f) {
    local_9 = '0';
  }
  else if (af_type == 0x30) {
    local_9 = '@';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

uint8_t
netaddr_get_af_maxprefix(uint32_t af_type) {
  switch (af_type) {
    case AF_INET:
      return 32;
      break;
    case AF_INET6:
      return 128;
    case AF_MAC48:
      return 48;
      break;
    case AF_EUI64:
      return 64;
      break;

    default:
      return 0;
  }
}